

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

string * __thiscall pbrt::DiffuseBxDF::ToString_abi_cxx11_(DiffuseBxDF *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  SampledSpectrum *in_stack_00000018;
  SampledSpectrum *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,float_const&,float_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,(float *)this);
  return in_RDI;
}

Assistant:

std::string DiffuseBxDF::ToString() const {
    return StringPrintf("[ DiffuseBxDF R: %s T: %s A: %f B: %f ]", R, T, A, B);
}